

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O2

void __thiscall
duckdb::BuildProbeSideOptimizer::TryFlipJoinChildren
          (BuildProbeSideOptimizer *this,LogicalOperator *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  type pLVar4;
  type pLVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  type pLVar6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  BuildSize BVar11;
  double local_88;
  double local_80;
  double local_78;
  vector<duckdb::ColumnBinding,_true> bindings_right;
  vector<duckdb::ColumnBinding,_true> bindings_left;
  
  this_00 = &op->children;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  if (pLVar4->has_estimated_cardinality == true) {
    iVar9 = pLVar4->estimated_cardinality;
  }
  else {
    iVar2 = (*pLVar4->_vptr_LogicalOperator[7])(pLVar4,this->context);
    iVar9 = CONCAT44(extraout_var,iVar2);
  }
  if (pLVar5->has_estimated_cardinality == true) {
    iVar10 = pLVar5->estimated_cardinality;
  }
  else {
    iVar2 = (*pLVar5->_vptr_LogicalOperator[7])(pLVar5,this->context);
    iVar10 = CONCAT44(extraout_var_00,iVar2);
  }
  BVar11 = GetBuildSizes(op,iVar9,iVar10);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  iVar7 = ChildHasJoins(pLVar6);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  iVar8 = ChildHasJoins(pLVar6);
  local_78 = BVar11.right_side;
  if (iVar8 == 0) {
    local_88 = local_78 * 1.15;
  }
  else {
    local_88 = local_78;
  }
  if (iVar7 == 0) {
    local_88 = local_78;
  }
  local_80 = BVar11.left_side;
  if ((iVar10 == iVar9) &&
     ((this->preferred_on_probe_side).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->preferred_on_probe_side).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    (*pLVar4->_vptr_LogicalOperator[2])(&bindings_left,pLVar4);
    (*pLVar5->_vptr_LogicalOperator[2])(&bindings_right,pLVar5);
    iVar9 = ComputeOverlappingBindings(&bindings_left,&this->preferred_on_probe_side);
    iVar10 = ComputeOverlappingBindings(&bindings_right,&this->preferred_on_probe_side);
    bVar1 = iVar9 < iVar10;
    if (local_80 < local_88) {
      bVar1 = iVar10 < iVar9;
    }
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                  &bindings_right);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                  &bindings_left);
    if (!(bool)(bVar1 ^ local_80 < local_88)) {
      return;
    }
  }
  else if (local_88 <= local_80) {
    return;
  }
  FlipChildren(op);
  return;
}

Assistant:

void BuildProbeSideOptimizer::TryFlipJoinChildren(LogicalOperator &op) const {
	auto &left_child = *op.children[0];
	auto &right_child = *op.children[1];
	const auto lhs_cardinality = left_child.has_estimated_cardinality ? left_child.estimated_cardinality
	                                                                  : left_child.EstimateCardinality(context);
	const auto rhs_cardinality = right_child.has_estimated_cardinality ? right_child.estimated_cardinality
	                                                                   : right_child.EstimateCardinality(context);

	auto build_sizes = GetBuildSizes(op, lhs_cardinality, rhs_cardinality);
	auto &left_side_build_cost = build_sizes.left_side;
	auto &right_side_build_cost = build_sizes.right_side;

	bool swap = false;

	idx_t left_child_joins = ChildHasJoins(*op.children[0]);
	idx_t right_child_joins = ChildHasJoins(*op.children[1]);
	// if the right child is a table scan, and the left child has joins, we should prefer the left child
	// to be the build side. Since the tuples of the left side will already have been built on/be in flight,
	// it will be faster to build on them again.
	if (right_child_joins == 0 && left_child_joins > 0) {
		right_side_build_cost *= (1 + PREFER_RIGHT_DEEP_PENALTY);
	}

	// RHS is build side.
	// if right_side metric is larger than left_side metric, then right_side is more costly to build on
	// than the lhs. So we swap
	if (right_side_build_cost > left_side_build_cost) {
		swap = true;
	}

	// swap for preferred on probe side
	if (rhs_cardinality == lhs_cardinality && !preferred_on_probe_side.empty()) {
		// inspect final bindings, we prefer them on the probe side
		auto bindings_left = left_child.GetColumnBindings();
		auto bindings_right = right_child.GetColumnBindings();
		auto bindings_in_left = ComputeOverlappingBindings(bindings_left, preferred_on_probe_side);
		auto bindings_in_right = ComputeOverlappingBindings(bindings_right, preferred_on_probe_side);
		// (if the sides are planning to be swapped AND
		// if more projected bindings are in the left (meaning right/build side after the swap)
		// then swap them back. The projected bindings stay in the left/probe side.)
		// OR
		// (if the sides are planning not to be swapped AND
		// if more projected bindings are in the right (meaning right/build)
		// then swap them. The projected bindings are swapped to the left/probe side.)
		if ((swap && bindings_in_left > bindings_in_right) || (!swap && bindings_in_right > bindings_in_left)) {
			swap = !swap;
		}
	}

	if (swap) {
		FlipChildren(op);
	}
}